

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O2

RpcValue __thiscall
miniros::master::Master::registerSubscriber
          (Master *this,string *caller_id,string *topic,string *type,string *caller_api,
          Connection *connection)

{
  Error EVar1;
  XmlRpcValue *pXVar2;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  RpcValue RVar3;
  long in_stack_00000008;
  XmlRpcValue XStack_138;
  string *local_128;
  string *local_120;
  ReturnStruct st;
  RequesterInfo requesterInfo;
  
  local_128 = type;
  local_120 = caller_api;
  RequesterInfo::RequesterInfo(&requesterInfo);
  EVar1 = RequesterInfo::assign(&requesterInfo,topic,*(int *)(in_stack_00000008 + 8));
  if (EVar1.code != Ok) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (registerSubscriber::loc.initialized_ == false) {
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&st,"miniros.unknown_package",(allocator<char> *)&XStack_138);
      console::initializeLogLocation(&registerSubscriber::loc,(string *)&st,Warn);
      ::std::__cxx11::string::~string((string *)&st);
    }
    if (registerSubscriber::loc.level_ != Warn) {
      console::setLogLocationLevel(&registerSubscriber::loc,Warn);
      console::checkLogLocationEnabled(&registerSubscriber::loc);
    }
    if (registerSubscriber::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,registerSubscriber::loc.logger_,
                     registerSubscriber::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/roscore/master.cpp"
                     ,300,
                     "Master::RpcValue miniros::master::Master::registerSubscriber(const std::string &, const std::string &, const std::string &, const std::string &, Connection *)"
                     ,"Failed to read network address of caller %s",(topic->_M_dataplus)._M_p);
    }
  }
  ::std::__cxx11::string::_M_assign((string *)&requesterInfo.callerApi);
  MasterHandler::registerSubscriber
            (&st,(MasterHandler *)(caller_id + 0x13),&requesterInfo,local_128,local_120);
  XmlRpc::XmlRpcValue::Array((XmlRpcValue *)this,3);
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&st.statusCode);
  XmlRpc::XmlRpcValue::XmlRpcValue(&XStack_138,&st.statusMessage);
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&XStack_138);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&XStack_138);
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&st.value);
  ReturnStruct::~ReturnStruct(&st);
  RequesterInfo::~RequesterInfo(&requesterInfo);
  RVar3._value.asDouble = extraout_RDX.asDouble;
  RVar3._0_8_ = this;
  return RVar3;
}

Assistant:

Master::RpcValue Master::registerSubscriber(const std::string& caller_id, const std::string& topic,
  const std::string& type, const std::string& caller_api, Connection* connection)
{
  RequesterInfo requesterInfo;
  if (!requesterInfo.assign(caller_id, connection->getfd())) {
    MINIROS_WARN("Failed to read network address of caller %s", caller_id.c_str());
  }
  requesterInfo.callerApi = caller_api;

  ReturnStruct st = m_handler.registerSubscriber(requesterInfo, topic, type);
  RpcValue res = RpcValue::Array(3);
  res[0] = st.statusCode;
  res[1] = st.statusMessage;
  res[2] = st.value;
  return res;
}